

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O2

int __thiscall cmGraphVizWriter::CollectAllExternalLibs(cmGraphVizWriter *this,int cnt)

{
  _Hash_node_base *p_Var1;
  bool bVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar3;
  iterator iVar4;
  ostream *this_00;
  mapped_type *this_01;
  mapped_type *ppcVar5;
  pointer ppcVar6;
  _Hash_node_base *p_Var7;
  __node_base *p_Var8;
  ostringstream ostr;
  int local_220;
  allocator local_219;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>_>
  *local_218;
  cmGraphVizWriter *local_210;
  pointer local_208;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_200;
  string *local_1f8;
  _Base_ptr local_1f0;
  key_type local_1e8;
  key_type local_1c8;
  string local_1a8 [11];
  
  pvVar3 = this->LocalGenerators;
  local_218 = &this->TargetPtrs;
  local_1f0 = &(this->TargetPtrs)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1f8 = (string *)&this->GraphNodePrefix;
  local_200 = &this->TargetNamesNodes;
  local_220 = cnt;
  local_210 = this;
  for (ppcVar6 = (pvVar3->
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      ppcVar6 !=
      (pvVar3->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
      super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
    p_Var8 = &((*ppcVar6)->Makefile->Targets)._M_h._M_before_begin;
    while (p_Var8 = p_Var8->_M_nxt, p_Var8 != (__node_base *)0x0) {
      std::__cxx11::string::string
                ((string *)local_1a8,(char *)p_Var8[1]._M_nxt,(allocator *)&local_1c8);
      bVar2 = IgnoreThisTarget(this,local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      if (!bVar2) {
        local_208 = ppcVar6;
        for (p_Var7 = p_Var8[0x5c]._M_nxt; ppcVar6 = local_208, this = local_210,
            p_Var7 != p_Var8[0x5d]._M_nxt; p_Var7 = p_Var7 + 5) {
          p_Var1 = p_Var7->_M_nxt;
          std::__cxx11::string::string((string *)local_1a8,(char *)p_Var1,(allocator *)&local_1c8);
          bVar2 = IgnoreThisTarget(local_210,local_1a8);
          std::__cxx11::string::~string((string *)local_1a8);
          if (!bVar2) {
            std::__cxx11::string::string((string *)local_1a8,(char *)p_Var1,(allocator *)&local_1c8)
            ;
            iVar4 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>_>
                    ::find(&local_218->_M_t,local_1a8);
            std::__cxx11::string::~string((string *)local_1a8);
            if (iVar4._M_node == local_1f0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              this_00 = std::operator<<((ostream *)local_1a8,local_1f8);
              std::ostream::operator<<(this_00,local_220);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string((string *)&local_1e8,(char *)p_Var1,&local_219);
              this_01 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](local_200,&local_1e8);
              std::__cxx11::string::operator=((string *)this_01,(string *)&local_1c8);
              std::__cxx11::string::~string((string *)&local_1e8);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::string
                        ((string *)&local_1c8,(char *)p_Var1,(allocator *)&local_1e8);
              ppcVar5 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmTarget_*>_>_>
                        ::operator[](local_218,&local_1c8);
              local_220 = local_220 + 1;
              *ppcVar5 = (mapped_type)0x0;
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            }
          }
        }
      }
    }
    pvVar3 = this->LocalGenerators;
  }
  return local_220;
}

Assistant:

int cmGraphVizWriter::CollectAllExternalLibs(int cnt)
{
  // Ok, now find all the stuff we link to that is not in cmake
  for (std::vector<cmLocalGenerator*>::const_iterator lit =
                                                 this->LocalGenerators.begin();
       lit != this->LocalGenerators.end();
       ++ lit )
    {
    const cmTargets* targets = &((*lit)->GetMakefile()->GetTargets());
    for ( cmTargets::const_iterator tit = targets->begin();
          tit != targets->end();
          ++ tit )
      {
      const char* realTargetName = tit->first.c_str();
      if (this->IgnoreThisTarget(realTargetName))
        {
        // Skip ignored targets
        continue;
        }
      const cmTarget::LinkLibraryVectorType* ll =
                                     &(tit->second.GetOriginalLinkLibraries());
      for (cmTarget::LinkLibraryVectorType::const_iterator llit = ll->begin();
           llit != ll->end();
           ++ llit )
        {
        const char* libName = llit->first.c_str();
        if (this->IgnoreThisTarget(libName))
          {
          // Skip ignored targets
          continue;
          }

        std::map<std::string, const cmTarget*>::const_iterator tarIt =
                                                this->TargetPtrs.find(libName);
        if ( tarIt == this->TargetPtrs.end() )
          {
          std::ostringstream ostr;
          ostr << this->GraphNodePrefix << cnt++;
          this->TargetNamesNodes[libName] = ostr.str();
          this->TargetPtrs[libName] = NULL;
          // str << "    \"" << ostr.c_str() << "\" [ label=\"" << libName
          // <<  "\" shape=\"ellipse\"];" << std::endl;
          }
        }
      }
    }
   return cnt;
}